

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_write_format_xar_empty.c
# Opt level: O0

void test_write_format_xar_empty(void)

{
  int iVar1;
  archive_entry *a_00;
  archive_entry *paVar2;
  size_t used;
  char buff [256];
  archive_entry *ae;
  archive *a;
  void *in_stack_fffffffffffffed8;
  archive_entry *paVar3;
  undefined4 in_stack_fffffffffffffee0;
  int in_stack_fffffffffffffee4;
  wchar_t in_stack_fffffffffffffee8;
  wchar_t in_stack_fffffffffffffeec;
  undefined4 in_stack_fffffffffffffef0;
  wchar_t in_stack_fffffffffffffef4;
  archive *in_stack_fffffffffffffef8;
  void *in_stack_ffffffffffffff10;
  
  a_00 = (archive_entry *)archive_write_new();
  assertion_assert((char *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                   in_stack_fffffffffffffeec,in_stack_fffffffffffffee8,
                   (char *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                   in_stack_fffffffffffffed8);
  iVar1 = archive_write_set_format_xar
                    ((archive *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0));
  if (iVar1 == 0) {
    archive_write_add_filter_none((archive *)a_00);
    assertion_equal_int((char *)in_stack_fffffffffffffef8,in_stack_fffffffffffffef4,
                        CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8),
                        (char *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                        (longlong)a_00,(char *)0x212f11,in_stack_ffffffffffffff10);
    archive_write_set_bytes_per_block
              ((archive *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8),
               in_stack_fffffffffffffee4);
    assertion_equal_int((char *)in_stack_fffffffffffffef8,in_stack_fffffffffffffef4,
                        CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8),
                        (char *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                        (longlong)a_00,(char *)0x212f55,in_stack_ffffffffffffff10);
    archive_write_set_bytes_in_last_block
              ((archive *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8),
               in_stack_fffffffffffffee4);
    assertion_equal_int((char *)in_stack_fffffffffffffef8,in_stack_fffffffffffffef4,
                        CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8),
                        (char *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                        (longlong)a_00,(char *)0x212f99,in_stack_ffffffffffffff10);
    archive_write_open_memory
              (in_stack_fffffffffffffef8,
               (void *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
               CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8),
               (size_t *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0));
    paVar3 = a_00;
    assertion_equal_int((char *)in_stack_fffffffffffffef8,in_stack_fffffffffffffef4,
                        CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8),
                        (char *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                        (longlong)a_00,(char *)0x212fe7,in_stack_ffffffffffffff10);
    paVar2 = archive_entry_new();
    assertion_assert((char *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                     in_stack_fffffffffffffeec,in_stack_fffffffffffffee8,
                     (char *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),paVar3);
    archive_entry_set_atime(paVar2,2,0);
    archive_entry_set_ctime(paVar2,4,0);
    archive_entry_set_mtime(paVar2,5,0);
    archive_entry_copy_pathname
              ((archive_entry *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
               (char *)paVar3);
    archive_entry_set_mode(paVar2,0x41ed);
    archive_write_header
              ((archive *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),paVar3);
    paVar3 = a_00;
    assertion_equal_int((char *)in_stack_fffffffffffffef8,in_stack_fffffffffffffef4,
                        CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8),
                        (char *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                        (longlong)a_00,(char *)0x2130cc,in_stack_ffffffffffffff10);
    archive_entry_free((archive_entry *)0x2130d9);
    paVar2 = archive_entry_new();
    assertion_assert((char *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                     in_stack_fffffffffffffeec,in_stack_fffffffffffffee8,
                     (char *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),paVar3);
    archive_entry_set_atime(paVar2,2,0);
    archive_entry_set_ctime(paVar2,4,0);
    archive_entry_set_mtime(paVar2,5,0);
    archive_entry_copy_pathname
              ((archive_entry *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
               (char *)paVar3);
    archive_entry_set_mode(paVar2,0x41ed);
    archive_write_header
              ((archive *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),paVar3);
    paVar3 = a_00;
    assertion_equal_int((char *)in_stack_fffffffffffffef8,in_stack_fffffffffffffef4,
                        CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8),
                        (char *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                        (longlong)a_00,(char *)0x2131be,in_stack_ffffffffffffff10);
    archive_entry_free((archive_entry *)0x2131cb);
    paVar2 = archive_entry_new();
    assertion_assert((char *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                     in_stack_fffffffffffffeec,in_stack_fffffffffffffee8,
                     (char *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),paVar3);
    archive_entry_set_atime(paVar2,2,0);
    archive_entry_set_ctime(paVar2,4,0);
    archive_entry_set_mtime(paVar2,5,0);
    archive_entry_copy_pathname
              ((archive_entry *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
               (char *)paVar3);
    archive_entry_set_mode(paVar2,0x41ed);
    archive_write_header
              ((archive *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),paVar3);
    paVar3 = a_00;
    assertion_equal_int((char *)in_stack_fffffffffffffef8,in_stack_fffffffffffffef4,
                        CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8),
                        (char *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                        (longlong)a_00,(char *)0x2132b0,in_stack_ffffffffffffff10);
    archive_entry_free((archive_entry *)0x2132bd);
    paVar2 = archive_entry_new();
    assertion_assert((char *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                     in_stack_fffffffffffffeec,in_stack_fffffffffffffee8,
                     (char *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),paVar3);
    archive_entry_set_atime(paVar2,2,0);
    archive_entry_set_ctime(paVar2,4,0);
    archive_entry_set_mtime(paVar2,5,0);
    archive_entry_copy_pathname
              ((archive_entry *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
               (char *)paVar3);
    archive_entry_set_mode(paVar2,0x41ed);
    archive_write_header
              ((archive *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),paVar3);
    paVar3 = a_00;
    assertion_equal_int((char *)in_stack_fffffffffffffef8,in_stack_fffffffffffffef4,
                        CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8),
                        (char *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                        (longlong)a_00,(char *)0x2133a2,in_stack_ffffffffffffff10);
    archive_entry_free((archive_entry *)0x2133af);
    paVar2 = archive_entry_new();
    assertion_assert((char *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                     in_stack_fffffffffffffeec,in_stack_fffffffffffffee8,
                     (char *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),paVar3);
    archive_entry_set_atime(paVar2,2,0);
    archive_entry_set_ctime(paVar2,4,0);
    archive_entry_set_mtime(paVar2,5,0);
    archive_entry_copy_pathname
              ((archive_entry *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
               (char *)paVar3);
    archive_entry_set_mode(paVar2,0x41ed);
    archive_write_header
              ((archive *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),paVar3);
    paVar3 = a_00;
    assertion_equal_int((char *)in_stack_fffffffffffffef8,in_stack_fffffffffffffef4,
                        CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8),
                        (char *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                        (longlong)a_00,(char *)0x213494,in_stack_ffffffffffffff10);
    archive_entry_free((archive_entry *)0x2134a1);
    paVar2 = archive_entry_new();
    assertion_assert((char *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                     in_stack_fffffffffffffeec,in_stack_fffffffffffffee8,
                     (char *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),paVar3);
    archive_entry_set_atime(paVar2,2,0);
    archive_entry_set_ctime(paVar2,4,0);
    archive_entry_set_mtime(paVar2,5,0);
    archive_entry_copy_pathname
              ((archive_entry *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
               (char *)paVar3);
    archive_entry_set_mode(paVar2,0x41ed);
    archive_write_header
              ((archive *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),paVar3);
    assertion_equal_int((char *)in_stack_fffffffffffffef8,in_stack_fffffffffffffef4,
                        CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8),
                        (char *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                        (longlong)a_00,(char *)0x213586,in_stack_ffffffffffffff10);
    archive_entry_free((archive_entry *)0x213593);
    archive_write_close((archive *)0x2135a0);
    assertion_equal_int((char *)in_stack_fffffffffffffef8,in_stack_fffffffffffffef4,
                        CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8),
                        (char *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                        (longlong)a_00,(char *)0x2135d2,in_stack_ffffffffffffff10);
    archive_write_free((archive *)0x2135df);
    assertion_equal_int((char *)in_stack_fffffffffffffef8,in_stack_fffffffffffffef4,
                        CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8),
                        (char *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),0,
                        (char *)0x21360d,in_stack_ffffffffffffff10);
    assertion_equal_int((char *)in_stack_fffffffffffffef8,in_stack_fffffffffffffef4,
                        CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8),
                        (char *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),0,
                        (char *)0x21363e,in_stack_ffffffffffffff10);
  }
  else {
    skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_xar_empty.c"
                   ,L',');
    test_skipping("xar is not supported on this platform");
    archive_write_free((archive *)0x212e9b);
    assertion_equal_int((char *)in_stack_fffffffffffffef8,in_stack_fffffffffffffef4,
                        CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8),
                        (char *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                        (longlong)a_00,(char *)0x212ecd,in_stack_ffffffffffffff10);
  }
  return;
}

Assistant:

DEFINE_TEST(test_write_format_xar_empty)
{
	struct archive *a;
	struct archive_entry *ae;
	char buff[256];
	size_t used;

	/* Xar format: Create a new archive in memory. */
	assert((a = archive_write_new()) != NULL);
	if (archive_write_set_format_xar(a) != ARCHIVE_OK) {
		skipping("xar is not supported on this platform");
		assertEqualIntA(a, ARCHIVE_OK, archive_write_free(a));
		return;
	}
	assertEqualIntA(a, ARCHIVE_OK, archive_write_add_filter_none(a));
	assertEqualIntA(a, ARCHIVE_OK, archive_write_set_bytes_per_block(a, 1));
	assertEqualIntA(a, ARCHIVE_OK, archive_write_set_bytes_in_last_block(a, 1));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_open_memory(a, buff, sizeof(buff), &used));

	/* Add "." entry which must be ignored. */ 
	assert((ae = archive_entry_new()) != NULL);
	archive_entry_set_atime(ae, 2, 0);
	archive_entry_set_ctime(ae, 4, 0);
	archive_entry_set_mtime(ae, 5, 0);
	archive_entry_copy_pathname(ae, ".");
	archive_entry_set_mode(ae, S_IFDIR | 0755);
	assertEqualIntA(a, ARCHIVE_OK, archive_write_header(a, ae));
	archive_entry_free(ae);

	/* Add ".." entry which must be ignored. */ 
	assert((ae = archive_entry_new()) != NULL);
	archive_entry_set_atime(ae, 2, 0);
	archive_entry_set_ctime(ae, 4, 0);
	archive_entry_set_mtime(ae, 5, 0);
	archive_entry_copy_pathname(ae, "..");
	archive_entry_set_mode(ae, S_IFDIR | 0755);
	assertEqualIntA(a, ARCHIVE_OK, archive_write_header(a, ae));
	archive_entry_free(ae);

	/* Add "/" entry which must be ignored. */ 
	assert((ae = archive_entry_new()) != NULL);
	archive_entry_set_atime(ae, 2, 0);
	archive_entry_set_ctime(ae, 4, 0);
	archive_entry_set_mtime(ae, 5, 0);
	archive_entry_copy_pathname(ae, "/");
	archive_entry_set_mode(ae, S_IFDIR | 0755);
	assertEqualIntA(a, ARCHIVE_OK, archive_write_header(a, ae));
	archive_entry_free(ae);

	/* Add "../" entry which must be ignored. */ 
	assert((ae = archive_entry_new()) != NULL);
	archive_entry_set_atime(ae, 2, 0);
	archive_entry_set_ctime(ae, 4, 0);
	archive_entry_set_mtime(ae, 5, 0);
	archive_entry_copy_pathname(ae, "../");
	archive_entry_set_mode(ae, S_IFDIR | 0755);
	assertEqualIntA(a, ARCHIVE_OK, archive_write_header(a, ae));
	archive_entry_free(ae);

	/* Add "../../." entry which must be ignored. */ 
	assert((ae = archive_entry_new()) != NULL);
	archive_entry_set_atime(ae, 2, 0);
	archive_entry_set_ctime(ae, 4, 0);
	archive_entry_set_mtime(ae, 5, 0);
	archive_entry_copy_pathname(ae, "../../.");
	archive_entry_set_mode(ae, S_IFDIR | 0755);
	assertEqualIntA(a, ARCHIVE_OK, archive_write_header(a, ae));
	archive_entry_free(ae);

	/* Add "..//.././" entry which must be ignored. */ 
	assert((ae = archive_entry_new()) != NULL);
	archive_entry_set_atime(ae, 2, 0);
	archive_entry_set_ctime(ae, 4, 0);
	archive_entry_set_mtime(ae, 5, 0);
	archive_entry_copy_pathname(ae, "..//.././");
	archive_entry_set_mode(ae, S_IFDIR | 0755);
	assertEqualIntA(a, ARCHIVE_OK, archive_write_header(a, ae));
	archive_entry_free(ae);

	/* Close out the archive without writing anything. */
	assertEqualIntA(a, ARCHIVE_OK, archive_write_close(a));
	assertEqualInt(ARCHIVE_OK, archive_write_free(a));

	/* Verify the correct format for an empy Xar archive. */
	assertEqualInt(used, 0);
}